

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall
Catch::TestCaseTracking::TrackerBase::TrackerHasName::operator()
          (TrackerHasName *this,Ptr<Catch::TestCaseTracking::ITracker> *tracker)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  (*(tracker->m_p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable.
    _vptr_NonCopyable[4])(&local_30);
  _Var1 = std::operator==(&local_30,&this->m_name);
  std::__cxx11::string::~string((string *)&local_30);
  return _Var1;
}

Assistant:

bool operator ()( Ptr<ITracker> const& tracker ) {
                return tracker->name() == m_name;
            }